

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.c
# Opt level: O0

void ptmr_stop(ptmr_t *tm)

{
  float64 fVar1;
  float64 fVar2;
  double dVar3;
  double dVar4;
  undefined1 local_c0 [8];
  rusage stop;
  timeval e_stop;
  float64 dt_elapsed;
  float64 dt_cpu;
  ptmr_t *tm_local;
  
  getrusage(RUSAGE_SELF,(rusage *)local_c0);
  fVar1 = make_sec((timeval *)local_c0);
  fVar2 = make_sec((timeval *)&stop.ru_utime.tv_usec);
  dVar3 = ((double)fVar1 + (double)fVar2) - (double)tm->start_cpu;
  gettimeofday((timeval *)&stop.field_15,(__timezone_ptr_t)0x0);
  fVar1 = make_sec((timeval *)&stop.field_15);
  dVar4 = (double)fVar1 - (double)tm->start_elapsed;
  tm->t_cpu = (float64)(dVar3 + (double)tm->t_cpu);
  tm->t_elapsed = (float64)(dVar4 + (double)tm->t_elapsed);
  tm->t_tot_cpu = (float64)(dVar3 + (double)tm->t_tot_cpu);
  tm->t_tot_elapsed = (float64)(dVar4 + (double)tm->t_tot_elapsed);
  return;
}

Assistant:

void
ptmr_stop(ptmr_t * tm)
{
    float64 dt_cpu, dt_elapsed;

#if (! defined(_WIN32)) || defined(GNUWINCE) || defined(__SYMBIAN32__)
    struct timeval e_stop;      /* Elapsed time */

#if (! defined(_HPUX_SOURCE))  && (! defined(__SYMBIAN32__))
    struct rusage stop;         /* CPU time */

    /* Unix but not HPUX */
    getrusage(RUSAGE_SELF, &stop);
    dt_cpu =
        make_sec(&stop.ru_utime) + make_sec(&stop.ru_stime) -
        tm->start_cpu;
#else
    dt_cpu = 0.0;
#endif
    /* Unix + HP */
    gettimeofday(&e_stop, 0);
    dt_elapsed = (make_sec(&e_stop) - tm->start_elapsed);
#elif defined(_WIN32_WP)
    dt_cpu = GetTickCount64() / 1000 - tm->start_cpu;
    dt_elapsed = GetTickCount64() / 1000 - tm->start_elapsed;
#elif defined(_WIN32_WCE)
    /* No GetProcessTimes() on WinCE.  (Note CPU time will be bogus) */
    dt_cpu = GetTickCount() / 1000 - tm->start_cpu;
    dt_elapsed = GetTickCount() / 1000 - tm->start_elapsed;
#else
    HANDLE pid;
    FILETIME t_create, t_exit, kst, ust;

    /* PC */
    pid = GetCurrentProcess();
    GetProcessTimes(pid, &t_create, &t_exit, &kst, &ust);
    dt_cpu = make_sec(&ust) + make_sec(&kst) - tm->start_cpu;
    dt_elapsed = ((float64) clock() / CLOCKS_PER_SEC) - tm->start_elapsed;
#endif

    tm->t_cpu += dt_cpu;
    tm->t_elapsed += dt_elapsed;

    tm->t_tot_cpu += dt_cpu;
    tm->t_tot_elapsed += dt_elapsed;
}